

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O0

iterator __thiscall
fmt::v5::internal::
arg_formatter_base<fmt::v5::output_range<fmt::v5::internal::counting_iterator<char>,_char>_>::
operator()(arg_formatter_base<fmt::v5::output_range<fmt::v5::internal::counting_iterator<char>,_char>_>
           *this,basic_string_view<char> value)

{
  basic_string_view<char> s;
  size_t in_RCX;
  void *in_RDX;
  int in_ESI;
  basic_writer<fmt::v5::output_range<fmt::v5::internal::counting_iterator<char>,_char>_> *in_RDI;
  iterator iVar1;
  error_handler *in_stack_ffffffffffffff88;
  undefined7 in_stack_ffffffffffffff90;
  char in_stack_ffffffffffffff97;
  basic_writer<fmt::v5::output_range<fmt::v5::internal::counting_iterator<char>,_char>_>
  *in_stack_ffffffffffffffa0;
  undefined1 in_stack_ffffffffffffffa8;
  undefined7 in_stack_ffffffffffffffa9;
  size_t in_stack_ffffffffffffffb0;
  error_handler local_29 [41];
  
  if (in_RDI[1].out_.count_ == 0) {
    basic_writer<fmt::v5::output_range<fmt::v5::internal::counting_iterator<char>,_char>_>::write
              (in_RDI,in_ESI,in_RDX,in_RCX);
  }
  else {
    in_stack_ffffffffffffff97 = *(char *)(in_RDI[1].out_.count_ + 0x11);
    error_handler::error_handler(local_29);
    check_string_type_spec<char,fmt::v5::internal::error_handler>
              (in_stack_ffffffffffffff97,in_stack_ffffffffffffff88);
    s.data_._1_7_ = in_stack_ffffffffffffffa9;
    s.data_._0_1_ = in_stack_ffffffffffffffa8;
    s.size_ = in_stack_ffffffffffffffb0;
    basic_writer<fmt::v5::output_range<fmt::v5::internal::counting_iterator<char>,_char>_>::
    write<char>(in_stack_ffffffffffffffa0,s,(format_specs *)in_RDI);
  }
  iVar1 = out((arg_formatter_base<fmt::v5::output_range<fmt::v5::internal::counting_iterator<char>,_char>_>
               *)CONCAT17(in_stack_ffffffffffffff97,in_stack_ffffffffffffff90));
  return iVar1;
}

Assistant:

iterator operator()(basic_string_view<char_type> value) {
    if (specs_) {
      internal::check_string_type_spec(
            specs_->type, internal::error_handler());
      writer_.write(value, *specs_);
    } else {
      writer_.write(value);
    }
    return out();
  }